

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  uint uVar4;
  GetterYs<double> *pGVar5;
  TransformerLogLin *pTVar6;
  ImPlotPlot *pIVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  uint uVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  pIVar12 = GImPlot;
  pGVar5 = this->Getter1;
  pTVar6 = this->Transformer;
  dVar20 = (double)(prim + 1);
  iVar3 = pGVar5->Count;
  dVar1 = *(double *)
           ((long)pGVar5->Ys +
           (long)(((prim + 1 + pGVar5->Offset) % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride);
  dVar16 = log10((pGVar5->XScale * dVar20 + pGVar5->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar13 = GImPlot;
  pIVar7 = pIVar12->CurrentPlot;
  dVar11 = (pIVar7->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  pGVar8 = this->Getter2;
  pTVar6 = this->Transformer;
  IVar2 = pIVar12->PixelRange[iVar3].Min;
  fVar18 = (float)(pIVar12->Mx *
                   (((double)(float)(dVar16 / pIVar12->LogDenX) *
                     ((pIVar7->XAxis).Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar2.x);
  fVar23 = (float)(pIVar12->My[iVar3] * (dVar1 - pIVar7->YAxis[iVar3].Range.Min) + (double)IVar2.y);
  dVar1 = pGVar8->YRef;
  dVar16 = log10((dVar20 * pGVar8->XScale + pGVar8->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar13->CurrentPlot;
  dVar11 = (pIVar7->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  IVar2 = pIVar13->PixelRange[iVar3].Min;
  fVar15 = (float)(pIVar13->Mx *
                   (((double)(float)(dVar16 / pIVar13->LogDenX) *
                     ((pIVar7->XAxis).Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar2.x);
  fVar17 = (float)(pIVar13->My[iVar3] * (dVar1 - pIVar7->YAxis[iVar3].Range.Min) + (double)IVar2.y);
  fVar24 = (this->P12).x;
  fVar25 = (this->P12).y;
  fVar27 = (this->P11).x;
  fVar28 = (this->P11).y;
  fVar19 = fVar23 * fVar27 - fVar18 * fVar28;
  fVar29 = fVar24 * fVar17 - fVar25 * fVar15;
  fVar27 = fVar27 - fVar18;
  fVar24 = fVar24 - fVar15;
  fVar26 = fVar25 - fVar17;
  fVar30 = fVar26 * fVar27 - (fVar28 - fVar23) * fVar24;
  auVar21._0_4_ = fVar19 * fVar24 - fVar29 * fVar27;
  auVar21._4_4_ = fVar19 * fVar26 - fVar29 * (fVar28 - fVar23);
  auVar21._8_4_ = fVar23 * 0.0 - fVar25 * 0.0;
  auVar21._12_4_ = fVar23 * 0.0 - fVar25 * 0.0;
  auVar22._4_4_ = fVar30;
  auVar22._0_4_ = fVar30;
  auVar22._8_4_ = fVar26;
  auVar22._12_4_ = fVar26;
  auVar22 = divps(auVar21,auVar22);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  pIVar9[1].pos.x = fVar18;
  pIVar9[1].pos.y = fVar23;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  pIVar9[2].pos = auVar22._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  pIVar9[4].uv.x = fVar15;
  pIVar9[4].uv.y = fVar17;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 5;
  uVar4 = DrawList->_VtxCurrentIdx;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = uVar4;
  uVar14 = -(uint)(fVar23 < fVar17 && fVar25 < fVar28 || fVar17 < fVar23 && fVar28 < fVar25) & 1;
  puVar10[1] = uVar4 + uVar14 + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = (uVar14 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar10[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar18;
  (this->P11).y = fVar23;
  (this->P12).x = fVar15;
  (this->P12).y = fVar17;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }